

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::AssertHelper::~AssertHelper(AssertHelper *this)

{
  AssertHelperData *ptr;
  
  ptr = this->data_;
  if (ptr != (AssertHelperData *)0x0) {
    std::__cxx11::string::~string((string *)&ptr->message);
  }
  operator_delete(ptr,0x38);
  return;
}

Assistant:

AssertHelper::~AssertHelper() { delete data_; }